

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.c
# Opt level: O3

_Bool TransformerUpdateTransformationMatrix(Transformer *transformer)

{
  Matrix *pMVar1;
  Matrix *pMVar2;
  Matrix *pMVar3;
  Matrix *pMVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST4;
  unkbyte10 local_558 [5];
  unkbyte10 local_508;
  unkbyte10 local_4b8;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  longdouble local_418;
  longdouble local_3f8;
  longdouble local_3e8;
  longdouble local_3d8;
  longdouble local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  Real_0_ local_358 [16];
  longdouble local_348;
  longdouble local_328;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  longdouble local_2d8;
  longdouble local_2c8;
  longdouble local_2a8;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  Real_0_ local_258 [16];
  longdouble local_248;
  longdouble local_238;
  longdouble local_228;
  longdouble local_1f8;
  longdouble local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  longdouble local_158;
  longdouble local_148;
  longdouble local_138;
  unkbyte10 local_128;
  longdouble local_118;
  longdouble local_108;
  longdouble local_f8;
  unkbyte10 local_e8;
  longdouble local_d8;
  longdouble local_c8;
  longdouble local_b8;
  unkbyte10 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Matrix *local_58;
  Matrix *local_50;
  Matrix *local_48;
  Matrix *local_40;
  Matrix *local_38;
  
  local_158 = (longdouble)1;
  local_148 = (longdouble)0;
  local_128 = *(unkbyte10 *)&(transformer->location).x;
  local_e8 = *(unkbyte10 *)&(transformer->location).y;
  local_a8 = *(unkbyte10 *)&(transformer->location).z;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0x8000000000000000;
  uStack_60 = 0x3fff;
  local_138 = local_148;
  local_118 = local_148;
  local_108 = local_158;
  local_f8 = local_148;
  local_d8 = local_148;
  local_c8 = local_148;
  local_b8 = local_158;
  local_38 = MatrixFromArray(4,4,(Real_0_ *)&local_158);
  memset(local_558,0,0xc0);
  local_558[0] = *(unkbyte10 *)&(transformer->scale).x;
  local_508 = *(unkbyte10 *)&(transformer->scale).y;
  local_4b8 = *(unkbyte10 *)&(transformer->scale).z;
  local_468 = 0x8000000000000000;
  uStack_460 = 0x3fff;
  local_478 = 0;
  uStack_470 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_498 = 0;
  uStack_490 = 0;
  pMVar1 = MatrixFromArray(4,4,(Real_0_ *)local_558);
  local_428 = 0;
  uStack_420 = 0;
  local_438 = 0;
  uStack_430 = 0;
  local_448 = 0;
  uStack_440 = 0;
  local_458 = 0;
  uStack_454 = 0x80000000;
  uStack_450 = 0x3fff;
  uStack_44c = 0;
  local_418 = (longdouble)0;
  lVar5 = in_ST4;
  cosl();
  sinl();
  local_3f8 = -in_ST1;
  local_3e8 = (longdouble)0;
  local_3d8 = local_3e8;
  sinl();
  cosl();
  local_3a8 = (longdouble)0;
  local_398 = 0;
  uStack_390 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_378 = 0;
  uStack_370 = 0;
  local_368 = 0x8000000000000000;
  uStack_360 = 0x3fff;
  pMVar2 = MatrixFromArray(4,4,(Real_0_ *)&local_458);
  cosl();
  local_348 = (longdouble)0;
  sinl();
  local_328 = (longdouble)0;
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0x8000000000000000;
  uStack_300 = 0x3fff;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  sinl();
  local_2d8 = -in_ST4;
  local_2c8 = (longdouble)0;
  cosl();
  local_2a8 = (longdouble)0;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_268 = 0x8000000000000000;
  uStack_260 = 0x3fff;
  pMVar3 = MatrixFromArray(4,4,local_358);
  cosl();
  sinl();
  local_248 = -lVar5;
  local_238 = (longdouble)0;
  local_228 = local_238;
  sinl();
  cosl();
  local_1f8 = (longdouble)0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0x8000000000000000;
  uStack_1b0 = 0x3fff;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0x8000000000000000;
  uStack_160 = 0x3fff;
  local_1e8 = local_1f8;
  pMVar4 = MatrixFromArray(4,4,local_258);
  local_58 = pMVar1;
  pMVar1 = MatrixMultiplication(local_38,pMVar1);
  local_50 = pMVar2;
  pMVar2 = MatrixMultiplication(pMVar1,pMVar2);
  local_48 = pMVar3;
  pMVar3 = MatrixMultiplication(pMVar2,pMVar3);
  local_40 = pMVar4;
  pMVar4 = MatrixMultiplication(pMVar3,pMVar4);
  if (transformer->matrix != (Matrix *)0x0) {
    MatrixDestroy(transformer->matrix);
  }
  transformer->matrix = pMVar4;
  if (transformer->inverseMatrix != (Matrix *)0x0) {
    MatrixDestroy(transformer->inverseMatrix);
  }
  pMVar4 = MatrixInverse(pMVar4);
  transformer->inverseMatrix = pMVar4;
  MatrixDestroy(pMVar3);
  MatrixDestroy(pMVar2);
  MatrixDestroy(pMVar1);
  MatrixDestroy(local_40);
  MatrixDestroy(local_48);
  MatrixDestroy(local_50);
  MatrixDestroy(local_58);
  MatrixDestroy(local_38);
  return true;
}

Assistant:

bool TransformerUpdateTransformationMatrix(Transformer *transformer) {
  // translate
  Real _translate[][4] = {{1, 0, 0, transformer->location.x}, {0, 1, 0, transformer->location.y}, {0, 0, 1, transformer->location.z}, {0, 0, 0, 1}};
  Matrix *translate = MatrixFromArray(4, 4, _translate);

  // scale
  Real _scale[][4] = {{transformer->scale.x, 0, 0, 0}, {0, transformer->scale.y, 0, 0}, {0, 0, transformer->scale.z, 0}, {0, 0, 0, 1}};
  Matrix *scale = MatrixFromArray(4, 4, _scale);

  // rotate X axis
  Real _rotateX[][4] = {
      {1, 0, 0, 0}, {0, cosl((transformer->rotation.x)), -sinl((transformer->rotation.x)), 0}, {0, sinl((transformer->rotation.x)), cosl((transformer->rotation.x)), 0}, {0, 0, 0, 1}};
  Matrix *rotateX = MatrixFromArray(4, 4, _rotateX);

  // rotate Y axis
  Real _rotateY[][4] = {{cosl(transformer->rotation.y), 0, sinl(transformer->rotation.y), 0}, {0, 1, 0, 0}, {-sinl(transformer->rotation.y), 0, cosl(transformer->rotation.y), 0}, {0, 0, 0, 1}};
  Matrix *rotateY = MatrixFromArray(4, 4, _rotateY);

  // rotate Z axis
  Real _rotateZ[][4] = {{cosl(transformer->rotation.z), -sinl(transformer->rotation.z), 0, 0}, {sinl(transformer->rotation.z), cosl(transformer->rotation.z), 0, 0}, {0, 0, 1, 0}, {0, 0, 0, 1}};
  Matrix *rotateZ = MatrixFromArray(4, 4, _rotateZ);

  Matrix *_a = MatrixMultiplication(translate, scale);
  Matrix *_b = MatrixMultiplication(_a, rotateX);
  Matrix *_c = MatrixMultiplication(_b, rotateY);
  Matrix *_d = MatrixMultiplication(_c, rotateZ);

  if (transformer->matrix != NULL) {
    MatrixDestroy(transformer->matrix);
  }
  transformer->matrix = _d;

  if (transformer->inverseMatrix != NULL) {
    MatrixDestroy(transformer->inverseMatrix);
  }
  transformer->inverseMatrix = MatrixInverse(_d);

  MatrixDestroy(_c);
  MatrixDestroy(_b);
  MatrixDestroy(_a);

  MatrixDestroy(rotateZ);
  MatrixDestroy(rotateY);
  MatrixDestroy(rotateX);

  MatrixDestroy(scale);
  MatrixDestroy(translate);

  return true;
}